

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

gdsPATH * drawPath(gdsPATH *__return_storage_ptr__,int layer,uint width,
                  vector<int,_std::allocator<int>_> *corX,vector<int,_std::allocator<int>_> *corY)

{
  gdsPATH::gdsPATH(__return_storage_ptr__);
  __return_storage_ptr__->layer = layer;
  __return_storage_ptr__->width = width;
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->xCor,corX);
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->yCor,corY);
  __return_storage_ptr__->pathtype = 2;
  return __return_storage_ptr__;
}

Assistant:

gdsPATH drawPath(int layer, unsigned int width, vector<int> &corX,
                 vector<int> &corY)
{
  gdsPATH foo;

  foo.layer = layer;
  foo.width = width;
  foo.xCor = corX;
  foo.yCor = corY;
  foo.pathtype = 2;

  return foo;
}